

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_write_file(char *file,kvtree *hash)

{
  mode_t mVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t nwrite;
  int fd;
  mode_t mode_file;
  int rc;
  kvtree *hash_local;
  char *file_local;
  
  if ((file == (char *)0x0) || (hash == (kvtree *)0x0)) {
    file_local._4_4_ = 1;
  }
  else {
    mVar1 = kvtree_getmode(1,1,0);
    iVar2 = kvtree_open(file,0x241,(ulong)mVar1);
    if (iVar2 < 0) {
      kvtree_err("Opening hash file for write: %s @ %s:%d",file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x4c3);
      file_local._4_4_ = 1;
    }
    else {
      sVar3 = kvtree_write_fd(file,iVar2,hash);
      fd = (int)(sVar3 < 0);
      iVar2 = kvtree_close(file,iVar2);
      if (iVar2 != 0) {
        fd = 1;
      }
      file_local._4_4_ = fd;
    }
  }
  return file_local._4_4_;
}

Assistant:

int kvtree_write_file(const char* file, const kvtree* hash)
{
  int rc = KVTREE_SUCCESS;

  /* check that we have a hash and a file name */
  if (file == NULL || hash == NULL) {
    return KVTREE_FAILURE;
  }

  /* open the hash file */
  mode_t mode_file = kvtree_getmode(1, 1, 0);
  int fd = kvtree_open(file, O_WRONLY | O_CREAT | O_TRUNC, mode_file);
  if (fd < 0) {
    kvtree_err("Opening hash file for write: %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* write the hash */
  ssize_t nwrite = kvtree_write_fd(file, fd, hash);
  if (nwrite < 0) {
    rc = KVTREE_FAILURE;
  }

  /* close the hash file */
  if (kvtree_close(file, fd) != KVTREE_SUCCESS) {
    rc = KVTREE_FAILURE;
  }

  return rc;
}